

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_storage.cpp
# Opt level: O3

intrusive_ptr<cppcms::impl::base_cache> __thiscall
cppcms::impl::thread_cache_factory(impl *this,uint items)

{
  mem_cache<cppcms::impl::thread_settings> *this_00;
  
  this_00 = (mem_cache<cppcms::impl::thread_settings> *)operator_new(0xe8);
  mem_cache<cppcms::impl::thread_settings>::mem_cache(this_00,items);
  *(mem_cache<cppcms::impl::thread_settings> **)this = this_00;
  (*(this_00->super_base_cache)._vptr_base_cache[6])(this_00);
  return (intrusive_ptr<cppcms::impl::base_cache>)(base_cache *)this;
}

Assistant:

booster::intrusive_ptr<base_cache> thread_cache_factory(unsigned items)
{
	return new mem_cache<thread_settings>(items);
}